

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cepstrum_to_minimum_phase_impulse_response.cc
# Opt level: O1

bool __thiscall
sptk::CepstrumToMinimumPhaseImpulseResponse::Run
          (CepstrumToMinimumPhaseImpulseResponse *this,
          vector<double,_std::allocator<double>_> *cepstrum,
          vector<double,_std::allocator<double>_> *minimum_phase_impulse_response)

{
  uint uVar1;
  int iVar2;
  double *pdVar3;
  double *pdVar4;
  bool bVar5;
  int iVar6;
  size_type __new_size;
  long lVar7;
  double *pdVar8;
  int iVar9;
  ulong uVar10;
  double *pdVar11;
  double dVar12;
  
  if (this->is_valid_ != true) {
    return false;
  }
  bVar5 = false;
  if ((minimum_phase_impulse_response != (vector<double,_std::allocator<double>_> *)0x0) &&
     (bVar5 = false,
     (long)(cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish -
     (long)(cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start >> 3 == (long)this->num_input_order_ + 1)) {
    __new_size = (long)this->num_output_order_ + 1;
    if ((long)(minimum_phase_impulse_response->super__Vector_base<double,_std::allocator<double>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(minimum_phase_impulse_response->super__Vector_base<double,_std::allocator<double>_>).
              _M_impl.super__Vector_impl_data._M_start >> 3 != __new_size) {
      std::vector<double,_std::allocator<double>_>::resize
                (minimum_phase_impulse_response,__new_size);
    }
    pdVar3 = (cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (minimum_phase_impulse_response->super__Vector_base<double,_std::allocator<double>_>).
             _M_impl.super__Vector_impl_data._M_start;
    dVar12 = exp(*pdVar3);
    *pdVar4 = dVar12;
    uVar1 = this->num_output_order_;
    bVar5 = true;
    if (0 < (int)uVar1) {
      iVar2 = this->num_input_order_;
      lVar7 = 1;
      pdVar8 = pdVar4;
      do {
        iVar6 = (int)lVar7;
        iVar9 = iVar6;
        if (iVar2 < iVar6) {
          iVar9 = iVar2;
        }
        if (iVar2 < 1) {
          dVar12 = 0.0;
        }
        else {
          dVar12 = 0.0;
          uVar10 = 1;
          pdVar11 = pdVar8;
          do {
            dVar12 = dVar12 + (double)(int)uVar10 * pdVar3[uVar10] * *pdVar11;
            uVar10 = uVar10 + 1;
            pdVar11 = pdVar11 + -1;
          } while (iVar9 + 1 != uVar10);
        }
        pdVar4[lVar7] = dVar12 / (double)iVar6;
        lVar7 = lVar7 + 1;
        pdVar8 = pdVar8 + 1;
      } while (lVar7 != (ulong)uVar1 + 1);
    }
  }
  return bVar5;
}

Assistant:

bool CepstrumToMinimumPhaseImpulseResponse::Run(
    const std::vector<double>& cepstrum,
    std::vector<double>* minimum_phase_impulse_response) const {
  // Check inputs.
  if (!is_valid_ ||
      cepstrum.size() != static_cast<std::size_t>(num_input_order_ + 1) ||
      NULL == minimum_phase_impulse_response) {
    return false;
  }

  // Prepare memories.
  if (minimum_phase_impulse_response->size() !=
      static_cast<std::size_t>(num_output_order_ + 1)) {
    minimum_phase_impulse_response->resize(num_output_order_ + 1);
  }

  const double* c(&cepstrum[0]);
  double* h(&((*minimum_phase_impulse_response)[0]));

  h[0] = std::exp(c[0]);
  for (int n(1); n <= num_output_order_; ++n) {
    double sum(0.0);
    const int end((num_input_order_ < n) ? num_input_order_ : n);
    for (int k(1); k <= end; ++k) {
      sum += k * c[k] * h[n - k];
    }
    h[n] = sum / n;
  }

  return true;
}